

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sampler.cpp
# Opt level: O1

float __thiscall blinnPhong::pdf(blinnPhong *this,Ray *ray,Vector3f *dir,Hit *h)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float *pfVar5;
  Vector3f *rv;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  double dVar12;
  double dVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  Vector3f ref_dir;
  Vector3f spec;
  Vector3f diff;
  Vector3f local_94;
  Vector3f local_88;
  Vector3f local_7c;
  Vector3f local_70;
  Vector3f local_64;
  Vector3f local_58;
  Vector3f local_4c;
  Vector3f local_40;
  Vector3f local_34;
  
  fVar11 = h->material->_shininess;
  Vector3f::Vector3f(&local_34,&h->material->_diffuseColor);
  Vector3f::Vector3f(&local_40,&h->material->_specularColor);
  pfVar5 = Vector3f::operator[](&local_34,0);
  fVar10 = *pfVar5;
  pfVar5 = Vector3f::operator[](&local_34,1);
  fVar16 = *pfVar5;
  pfVar5 = Vector3f::operator[](&local_34,2);
  fVar1 = *pfVar5;
  pfVar5 = Vector3f::operator[](&local_40,0);
  fVar2 = *pfVar5;
  pfVar5 = Vector3f::operator[](&local_40,1);
  fVar3 = *pfVar5;
  pfVar5 = Vector3f::operator[](&local_40,2);
  fVar4 = *pfVar5;
  rv = &h->normal;
  Vector3f::Vector3f(&local_94,rv);
  fVar6 = Vector3f::dot(dir,&local_94);
  Vector3f::Vector3f(&local_4c,&ray->_direction);
  Vector3f::Vector3f(&local_64,&ray->_direction);
  Vector3f::Vector3f(&local_70,rv);
  fVar7 = Vector3f::dot(&local_64,&local_70);
  Vector3f::Vector3f(&local_7c,rv);
  ::operator*(fVar7 + fVar7,&local_58);
  operator-(&local_4c,&local_58);
  Vector3f::normalized(&local_94);
  Vector3f::Vector3f(&local_88,rv);
  fVar7 = Vector3f::dot(&local_94,&local_88);
  fVar8 = 1.0 - fVar7 * fVar7;
  if (fVar8 < 0.0) {
    fVar8 = sqrtf(fVar8);
  }
  else {
    fVar8 = SQRT(fVar8);
  }
  dVar12 = fmod((double)fVar11,2.0);
  fVar17 = 3.1415927;
  if ((dVar12 == 0.0) && (fVar17 = 3.1415927, !NAN(dVar12))) {
    fVar17 = fVar8 + fVar8;
  }
  fVar9 = 3.1415927;
  if ((dVar12 == 0.0) && (fVar9 = 3.1415927, !NAN(dVar12))) {
    dVar13 = acos((double)fVar7);
    fVar9 = (float)((3.141592653589793 - dVar13) + (3.141592653589793 - dVar13));
  }
  fVar14 = 0.0;
  fVar15 = 0.0;
  if ((dVar12 == 0.0) && (fVar15 = 0.0, !NAN(dVar12))) {
    fVar15 = 1.0;
  }
  for (; fVar15 <= fVar11 + -1.0; fVar15 = fVar15 + 2.0) {
    fVar14 = fVar14 + fVar17;
    fVar17 = ((fVar15 + 1.0) * fVar17 * fVar8 * fVar8) / (fVar15 + 2.0);
  }
  fVar6 = fVar6 / 3.1415927;
  if (fVar6 <= 0.0) {
    fVar6 = 0.0;
  }
  fVar16 = 1.0 / ((fVar10 + fVar16 + fVar1) / (fVar2 + fVar3 + fVar4) + 1.0);
  fVar10 = Vector3f::dot(&local_94,dir);
  dVar12 = pow((double)fVar10,(double)fVar11);
  fVar11 = (float)(dVar12 / (double)((fVar7 * fVar14 + fVar9) / (fVar11 + 1.0)));
  if (fVar11 <= 0.0) {
    fVar11 = 0.0;
  }
  return fVar11 * fVar16 + (1.0 - fVar16) * fVar6;
}

Assistant:

float blinnPhong::pdf(const Ray &ray, const Vector3f &dir, Hit &h) const {
    float shininess = h.getMaterial()->getShininess();
    Vector3f diff = h.getMaterial()->getDiffuseColor();
    Vector3f spec = h.getMaterial()->getSpecularColor();
    float prob_spec = 1.f / (1.f + (diff[0] + diff[1] + diff[2]) / (spec[0] + spec[1] + spec[2]));

    float diffuse_pdf = Vector3f::dot(dir, h.getNormal()) / M_PI;
    diffuse_pdf = diffuse_pdf > 0 ? diffuse_pdf : 0;


    Vector3f ref_dir = (ray.getDirection() - 2 * Vector3f::dot(ray.getDirection(), h.getNormal()) * h.getNormal()).normalized();
    float S = 0;
    float d = Vector3f::dot(ref_dir, h.getNormal());
    float c = sqrt(1-d*d);
    bool even = fmod(shininess, 2.) == 0.;
    float T = even ? 2.f*c : (float)M_PI;
    float A = even ? (float)2*(M_PI-acos(d)) : (float)M_PI;
    float i = even ? 1 : 0;

    while (i <= shininess-1) {
        S = S+T;
        T = T*c*c*(i+1.)/(i+2.);
        i = i+2;
    }

    float specular_norm = (A + d*(S)) / (shininess+1);
    float specular_pdf = pow(Vector3f::dot(ref_dir, dir), shininess) / specular_norm;
    specular_pdf = specular_pdf > 0 ? specular_pdf : 0;

    return prob_spec * specular_pdf + (1-prob_spec) * diffuse_pdf;

}